

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geo_parquet.cpp
# Opt level: O2

unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
 __thiscall
duckdb::GeoParquetFileMetadata::TryRead
          (GeoParquetFileMetadata *this,FileMetaData *file_meta_data,ClientContext *context)

{
  pointer pKVar1;
  code *pcVar2;
  undefined8 uVar3;
  _Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false> _Var4;
  undefined8 *puVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  pointer pGVar9;
  InvalidInputException *pIVar10;
  ulong uVar11;
  yyjson_val *key;
  ulong *puVar12;
  pointer pKVar13;
  ulong uVar14;
  size_t len;
  ulong *puVar15;
  ulong uVar16;
  allocator local_e9;
  _Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false> local_e8;
  undefined8 *local_e0;
  ulong *local_d8;
  key_type local_d0;
  char *local_b0;
  ulong local_a8;
  ulong local_a0;
  mapped_type *local_98;
  string local_90 [32];
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar6 = IsGeoParquetConversionEnabled(context);
  if (bVar6) {
    pKVar1 = (file_meta_data->key_value_metadata).
             super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
             super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pKVar13 = (file_meta_data->key_value_metadata).
                   super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                   .
                   super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                   ._M_impl.super__Vector_impl_data._M_start; pKVar13 != pKVar1;
        pKVar13 = pKVar13 + 1) {
      bVar6 = std::operator==(&pKVar13->key,"geo");
      if (bVar6) {
        local_e0 = (undefined8 *)
                   duckdb_yyjson::yyjson_read_opts
                             ((pKVar13->value)._M_dataplus._M_p,(pKVar13->value)._M_string_length,0,
                              (yyjson_alc *)0x0,(yyjson_read_err *)0x0);
        if (local_e0 != (undefined8 *)0x0) {
          puVar12 = (ulong *)*local_e0;
          if ((puVar12 == (ulong *)0x0) || ((~(uint)*puVar12 & 7) != 0)) {
            pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string
                      ((string *)&local_d0,"Geoparquet metadata is not an object",&local_e9);
            duckdb::InvalidInputException::InvalidInputException(pIVar10,(string *)&local_d0);
            __cxa_throw(pIVar10,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error)
            ;
          }
          local_e8._M_head_impl = this;
          make_uniq<duckdb::GeoParquetFileMetadata>();
          local_d8 = puVar12;
          if ((~(uint)*puVar12 & 7) != 0) goto LAB_0030343a;
          uVar14 = *puVar12 >> 8;
          puVar12 = puVar12 + 2;
          puVar15 = puVar12;
          goto LAB_00302f66;
        }
        break;
      }
    }
  }
  (this->write_lock).super___mutex_base._M_mutex.__align = 0;
  return (unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
          )(unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
            )this;
LAB_00302f66:
  bVar6 = uVar14 == 0;
  uVar14 = uVar14 - 1;
  if (bVar6) {
LAB_0030343a:
    pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&local_d0,"Geoparquet metadata does not have a version",&local_e9);
    duckdb::InvalidInputException::InvalidInputException(pIVar10,(string *)&local_d0);
    __cxa_throw(pIVar10,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
  }
  if (((*puVar15 & 0xffffffffffffff00) == 0x700) &&
     (iVar8 = bcmp((void *)puVar15[1],"version",7), _Var4._M_head_impl = local_e8._M_head_impl,
     iVar8 == 0)) {
    if ((puVar15[2] & 7) == 5) {
      pGVar9 = unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
               ::operator->((unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
                             *)local_e8._M_head_impl);
      std::__cxx11::string::assign((char *)&pGVar9->version);
      pGVar9 = unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
               ::operator->((unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
                             *)_Var4._M_head_impl);
      std::__cxx11::string::string(local_70,(string *)&pGVar9->version);
      std::__cxx11::string::string(local_90,"2",(allocator *)&local_d0);
      cVar7 = duckdb::StringUtil::StartsWith(local_70,local_90);
      std::__cxx11::string::~string(local_90);
      std::__cxx11::string::~string(local_70);
      if (cVar7 != '\0') {
        pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&local_d0,"Geoparquet version %s is not supported",&local_e9);
        pGVar9 = unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
                 ::operator->((unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
                               *)local_e8._M_head_impl);
        std::__cxx11::string::string((string *)&local_50,(string *)&pGVar9->version);
        InvalidInputException::InvalidInputException<std::__cxx11::string>
                  (pIVar10,&local_d0,&local_50);
        __cxa_throw(pIVar10,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((~(uint)*local_d8 & 7) != 0) goto LAB_00303492;
      uVar14 = *local_d8 >> 8;
      puVar15 = puVar12;
      goto LAB_0030308a;
    }
    goto LAB_0030343a;
  }
  uVar16 = 0x10;
  if ((~(uint)puVar15[2] & 6) == 0) {
    uVar16 = puVar15[3];
  }
  puVar15 = (ulong *)((long)puVar15 + uVar16 + 0x10);
  goto LAB_00302f66;
LAB_0030308a:
  bVar6 = uVar14 == 0;
  uVar14 = uVar14 - 1;
  if (bVar6) {
LAB_00303492:
    pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&local_d0,"Geoparquet metadata does not have a primary column",&local_e9);
    duckdb::InvalidInputException::InvalidInputException(pIVar10,(string *)&local_d0);
    __cxa_throw(pIVar10,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
  }
  if (((*puVar15 & 0xffffffffffffff00) == 0xe00) &&
     (iVar8 = bcmp((void *)puVar15[1],"primary_column",0xe), iVar8 == 0)) {
    if ((puVar15[2] & 7) == 5) {
      pGVar9 = unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
               ::operator->((unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
                             *)local_e8._M_head_impl);
      std::__cxx11::string::assign((char *)&pGVar9->primary_geometry_column);
      if ((~(uint)*local_d8 & 7) != 0) goto LAB_003034ea;
      uVar14 = *local_d8 >> 8;
      goto LAB_00303131;
    }
    goto LAB_00303492;
  }
  uVar16 = 0x10;
  if ((~(uint)puVar15[2] & 6) == 0) {
    uVar16 = puVar15[3];
  }
  puVar15 = (ulong *)((long)puVar15 + uVar16 + 0x10);
  goto LAB_0030308a;
LAB_00303131:
  bVar6 = uVar14 == 0;
  uVar14 = uVar14 - 1;
  if (bVar6) {
LAB_003034ea:
    pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&local_d0,"Geoparquet metadata does not have a columns object",&local_e9);
    duckdb::InvalidInputException::InvalidInputException(pIVar10,(string *)&local_d0);
    __cxa_throw(pIVar10,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
  }
  if (((*puVar12 & 0xffffffffffffff00) == 0x700) &&
     (iVar8 = bcmp((void *)puVar12[1],"columns",7), iVar8 == 0)) {
    if ((~(uint)puVar12[2] & 7) == 0) {
      local_a0 = puVar12[2] >> 8;
      local_a8 = 0;
      puVar12 = puVar12 + 4;
      do {
        puVar5 = local_e0;
        _Var4._M_head_impl = local_e8._M_head_impl;
        if (local_a8 == local_a0) {
          pcVar2 = (code *)local_e0[3];
          uVar3 = local_e0[4];
          local_e0[1] = 0;
          local_e0[2] = 0;
          local_e0[3] = 0;
          local_e0[4] = 0;
          if (local_e0[7] != 0) {
            (*pcVar2)(uVar3);
          }
          (*pcVar2)(uVar3,puVar5);
          return (unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                  )(unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                    )_Var4._M_head_impl;
        }
        local_d8 = (ulong *)0x10;
        if ((~(uint)puVar12[2] & 6) == 0) {
          local_d8 = (ulong *)puVar12[3];
        }
        if ((*puVar12 & 7) == 5) {
          local_b0 = (char *)puVar12[1];
        }
        else {
          local_b0 = (char *)0x0;
        }
        pGVar9 = unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
                 ::operator->((unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
                               *)local_e8._M_head_impl);
        std::__cxx11::string::string((string *)&local_d0,local_b0,&local_e9);
        local_98 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&pGVar9->geometry_columns,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        if ((~(uint)puVar12[2] & 7) != 0) {
          pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string
                    ((string *)&local_d0,"Geoparquet column \'%s\' is not an object",&local_e9);
          InvalidInputException::InvalidInputException<char_const*>(pIVar10,&local_d0,local_b0);
          __cxa_throw(pIVar10,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
        }
        local_a8 = local_a8 + 1;
        local_d8 = (ulong *)((long)puVar12 + (long)local_d8 + 0x10U);
        uVar16 = puVar12[2] >> 8;
        puVar15 = puVar12 + 4;
        puVar12 = puVar15;
        uVar14 = uVar16;
        while( true ) {
          bVar6 = uVar14 == 0;
          uVar14 = uVar14 - 1;
          if (bVar6) goto LAB_003033dd;
          if (((*puVar12 & 0xffffffffffffff00) == 0x800) &&
             (*(long *)puVar12[1] == 0x676e69646f636e65)) break;
          uVar11 = 0x10;
          if ((~(uint)puVar12[2] & 6) == 0) {
            uVar11 = puVar12[3];
          }
          puVar12 = (ulong *)((long)puVar12 + uVar11 + 0x10);
        }
        if ((puVar12[2] & 7) != 5) {
LAB_003033dd:
          pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string
                    ((string *)&local_d0,"Geoparquet column \'%s\' does not have an encoding",
                     &local_e9);
          InvalidInputException::InvalidInputException<char_const*>(pIVar10,&local_d0,local_b0);
          __cxa_throw(pIVar10,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
        }
        iVar8 = strcmp((char *)puVar12[3],"WKB");
        if (iVar8 != 0) {
          pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string
                    ((string *)&local_d0,"Geoparquet column \'%s\' has an unsupported encoding",
                     &local_e9);
          InvalidInputException::InvalidInputException<char_const*>(pIVar10,&local_d0,local_b0);
          __cxa_throw(pIVar10,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
        }
        local_98->geometry_encoding = WKB;
        while( true ) {
          bVar6 = uVar16 == 0;
          uVar16 = uVar16 - 1;
          if (bVar6) goto LAB_0030333f;
          if (((*puVar15 & 0xffffffffffffff00) == 0xe00) &&
             (iVar8 = bcmp((void *)puVar15[1],"geometry_types",0xe), iVar8 == 0)) break;
          uVar14 = 0x10;
          if ((~(uint)puVar15[2] & 6) == 0) {
            uVar14 = puVar15[3];
          }
          puVar15 = (ulong *)((long)puVar15 + uVar14 + 0x10);
        }
        puVar12 = local_d8;
      } while ((puVar15[2] & 7) == 6);
LAB_0030333f:
      pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_d0,"Geoparquet column \'%s\' does not have geometry types",
                 &local_e9);
      InvalidInputException::InvalidInputException<char_const*>(pIVar10,&local_d0,local_b0);
      __cxa_throw(pIVar10,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_003034ea;
  }
  uVar16 = 0x10;
  if ((~(uint)puVar12[2] & 6) == 0) {
    uVar16 = puVar12[3];
  }
  puVar12 = (ulong *)((long)puVar12 + uVar16 + 0x10);
  goto LAB_00303131;
}

Assistant:

unique_ptr<GeoParquetFileMetadata> GeoParquetFileMetadata::TryRead(const duckdb_parquet::FileMetaData &file_meta_data,
                                                                   const ClientContext &context) {

	// Conversion not enabled, or spatial is not loaded!
	if (!IsGeoParquetConversionEnabled(context)) {
		return nullptr;
	}

	for (auto &kv : file_meta_data.key_value_metadata) {
		if (kv.key == "geo") {
			const auto geo_metadata = yyjson_read(kv.value.c_str(), kv.value.size(), 0);
			if (!geo_metadata) {
				// Could not parse the JSON
				return nullptr;
			}

			try {
				// Check the root object
				const auto root = yyjson_doc_get_root(geo_metadata);
				if (!yyjson_is_obj(root)) {
					throw InvalidInputException("Geoparquet metadata is not an object");
				}

				auto result = make_uniq<GeoParquetFileMetadata>();

				// Check and parse the version
				const auto version_val = yyjson_obj_get(root, "version");
				if (!yyjson_is_str(version_val)) {
					throw InvalidInputException("Geoparquet metadata does not have a version");
				}
				result->version = yyjson_get_str(version_val);
				if (StringUtil::StartsWith(result->version, "2")) {
					// Guard against a breaking future 2.0 version
					throw InvalidInputException("Geoparquet version %s is not supported", result->version);
				}

				// Check and parse the primary geometry column
				const auto primary_geometry_column_val = yyjson_obj_get(root, "primary_column");
				if (!yyjson_is_str(primary_geometry_column_val)) {
					throw InvalidInputException("Geoparquet metadata does not have a primary column");
				}
				result->primary_geometry_column = yyjson_get_str(primary_geometry_column_val);

				// Check and parse the geometry columns
				const auto columns_val = yyjson_obj_get(root, "columns");
				if (!yyjson_is_obj(columns_val)) {
					throw InvalidInputException("Geoparquet metadata does not have a columns object");
				}

				// Iterate over all geometry columns
				yyjson_obj_iter iter = yyjson_obj_iter_with(columns_val);
				yyjson_val *column_key;

				while ((column_key = yyjson_obj_iter_next(&iter))) {
					const auto column_val = yyjson_obj_iter_get_val(column_key);
					const auto column_name = yyjson_get_str(column_key);

					auto &column = result->geometry_columns[column_name];

					if (!yyjson_is_obj(column_val)) {
						throw InvalidInputException("Geoparquet column '%s' is not an object", column_name);
					}

					// Parse the encoding
					const auto encoding_val = yyjson_obj_get(column_val, "encoding");
					if (!yyjson_is_str(encoding_val)) {
						throw InvalidInputException("Geoparquet column '%s' does not have an encoding", column_name);
					}
					const auto encoding_str = yyjson_get_str(encoding_val);
					if (strcmp(encoding_str, "WKB") == 0) {
						column.geometry_encoding = GeoParquetColumnEncoding::WKB;
					} else {
						throw InvalidInputException("Geoparquet column '%s' has an unsupported encoding", column_name);
					}

					// Parse the geometry types
					const auto geometry_types_val = yyjson_obj_get(column_val, "geometry_types");
					if (!yyjson_is_arr(geometry_types_val)) {
						throw InvalidInputException("Geoparquet column '%s' does not have geometry types", column_name);
					}
					// We dont care about the geometry types for now.

					// TODO: Parse the bounding box, other metadata that might be useful.
					// (Only encoding and geometry types are required to be present)
				}

				// Return the result
				// Make sure to free the JSON document
				yyjson_doc_free(geo_metadata);
				return result;

			} catch (...) {
				// Make sure to free the JSON document in case of an exception
				yyjson_doc_free(geo_metadata);
				throw;
			}
		}
	}
	return nullptr;
}